

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O2

shared_ptr<Kandinsky::BaseExpression> __thiscall
Kandinsky::BaseExpression::makePtr<Kandinsky::Variable>(BaseExpression *this,Variable *arg)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Kandinsky::BaseExpression> sVar2;
  __shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_18,
             &(arg->m_variableExpressionPtr).
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>);
  _Var1._M_pi = local_18._M_refcount._M_pi;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_BaseExpression = (_func_int **)local_18._M_ptr;
  this[1]._vptr_BaseExpression = (_func_int **)_Var1._M_pi;
  local_18._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  sVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Kandinsky::BaseExpression>)
         sVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BaseExpression> BaseExpression::makePtr<Variable>(const Variable& arg)
    {
        return arg.getVariableExpressionPtr();
    }